

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O1

real_t __thiscall
xLearn::FFMScore::CalcScore(FFMScore *this,SparseRow *row,Model *model,real_t norm)

{
  pointer pNVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  pointer pNVar6;
  float fVar7;
  int iVar8;
  pointer pNVar9;
  uint uVar10;
  ulong uVar11;
  pointer pNVar12;
  int iVar13;
  uint uVar14;
  pointer pNVar15;
  undefined1 auVar16 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [64];
  undefined1 extraout_var [60];
  
  auVar19 = in_ZMM2._0_16_;
  auVar17 = in_ZMM1._0_16_;
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = norm;
  if (norm < 0.0) {
    auVar18._0_4_ = sqrtf(norm);
    auVar18._4_60_ = extraout_var;
    auVar16 = auVar18._0_16_;
  }
  else {
    auVar16 = vsqrtss_avx(auVar20._0_16_,auVar20._0_16_);
  }
  auVar20 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar4 = model->num_feat_;
  auVar17 = vcvtusi2ss_avx512f(auVar17,model->aux_size_);
  iVar8 = vcvttss2usi_avx512f(auVar17);
  pNVar9 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar6 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar9 != pNVar6) {
    pNVar12 = pNVar9;
    do {
      if (pNVar12->feat_id < uVar4) {
        auVar17 = vfmadd231ss_fma(auVar20._0_16_,auVar16,
                                  ZEXT416((uint)(pNVar12->feat_val *
                                                model->param_w_[pNVar12->feat_id * iVar8])));
        auVar20 = ZEXT1664(auVar17);
      }
      pNVar12 = pNVar12 + 1;
    } while (pNVar12 != pNVar6);
  }
  if (pNVar9 == pNVar6) {
    auVar17 = ZEXT816(0) << 0x40;
  }
  else {
    uVar5 = model->num_field_;
    auVar17 = vcvtusi2ss_avx512f(auVar19,model->num_K_);
    auVar17 = ZEXT416((uint)(auVar17._0_4_ * 0.25));
    auVar17 = vroundss_avx(auVar17,auVar17,10);
    iVar13 = vcvttss2usi_avx512f(auVar17);
    uVar14 = iVar13 * iVar8 * 4;
    auVar18 = ZEXT864(0) << 0x20;
    do {
      if ((pNVar9->field_id < uVar5 && pNVar9->feat_id < uVar4) && (pNVar9 + 1 != pNVar6)) {
        pNVar12 = pNVar9;
        pNVar15 = pNVar9 + 1;
        do {
          if ((pNVar12[1].field_id < uVar5 && pNVar12[1].feat_id < uVar4) &&
             ((iVar13 * iVar8 & 0x3fffffffU) != 0)) {
            fVar7 = pNVar9->feat_val * pNVar12[1].feat_val * norm;
            uVar11 = 0;
            do {
              pfVar2 = model->param_v_ +
                       (ulong)(pNVar9->feat_id * uVar14 * uVar5) +
                       pNVar12[1].field_id * uVar14 + uVar11;
              pfVar3 = model->param_v_ +
                       (ulong)(pNVar9->field_id * uVar14) +
                       pNVar12[1].feat_id * uVar14 * uVar5 + uVar11;
              auVar18 = ZEXT1664(CONCAT412(auVar18._12_4_ + fVar7 * pfVar2[3] * pfVar3[3],
                                           CONCAT48(auVar18._8_4_ + fVar7 * pfVar2[2] * pfVar3[2],
                                                    CONCAT44(auVar18._4_4_ +
                                                             fVar7 * pfVar2[1] * pfVar3[1],
                                                             auVar18._0_4_ +
                                                             fVar7 * *pfVar2 * *pfVar3))));
              uVar10 = (int)uVar11 + iVar8 * 4;
              uVar11 = (ulong)uVar10;
            } while (uVar10 < uVar14);
          }
          pNVar1 = pNVar15 + 1;
          pNVar12 = pNVar15;
          pNVar15 = pNVar1;
        } while (pNVar1 != pNVar6);
      }
      auVar17 = auVar18._0_16_;
      pNVar9 = pNVar9 + 1;
    } while (pNVar9 != pNVar6);
  }
  auVar17 = vhaddps_avx(auVar17,auVar17);
  auVar17 = vhaddps_avx(auVar17,auVar17);
  return auVar20._0_4_ + *model->param_b_ + auVar17._0_4_;
}

Assistant:

real_t FFMScore::CalcScore(const SparseRow* row,
                           Model& model,
                           real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sum_w = 0;
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  index_t aux_size = model.GetAuxiliarySize();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    sum_w += (iter->feat_val * w[feat_id*aux_size] * sqrt_norm);
  }
  // bias
  w = model.GetParameter_b();
  sum_w += w[0];
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = aux_size * model.get_aligned_k();
  index_t align1 = num_field * align0;
  int align = kAlign * aux_size;
  w = model.GetParameter_v();
  __m128 XMMt = _mm_setzero_ps();
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature in Prediction
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      for (index_t d = 0; d < align0; d += align) {
        __m128 XMMw1 = _mm_load_ps(w1_base + d);
        __m128 XMMw2 = _mm_load_ps(w2_base + d);
        XMMt = _mm_add_ps(XMMt,
               _mm_mul_ps(
               _mm_mul_ps(XMMw1, XMMw2), XMMv));
      }
    }
  }
  real_t sum_v = 0;
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  _mm_store_ss(&sum_v, XMMt);

  return sum_v + sum_w;
}